

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

ResourceAttribution * __thiscall
Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::
GetResourceAttribution<Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>>
          (ResourceAttribution *__return_storage_ptr__,
          PipelineStateBase<Diligent::EngineGLImplTraits> *this,char *Name,SHADER_TYPE Stage,
          RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *pSignatures,Uint32 SignCount)

{
  Uint32 UVar1;
  Char *Message;
  PipelineResourceSignatureGLImpl *_pSignature;
  undefined4 in_register_0000000c;
  Uint32 ImtblSamIndex;
  Uint32 ResIndex;
  PipelineResourceSignatureImplType *pSignature;
  Uint32 sign;
  undefined1 local_48 [8];
  string msg;
  Uint32 SignCount_local;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *pSignatures_local;
  SHADER_TYPE Stage_local;
  char *Name_local;
  
  msg.field_2._12_4_ = SUB84(pSignatures,0);
  if ((this == (PipelineStateBase<Diligent::EngineGLImplTraits> *)0x0) ||
     (*(char *)&(this->
                super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                ).super_ObjectBase<Diligent::IPipelineStateGL>.
                super_RefCountedObject<Diligent::IPipelineStateGL>.super_IPipelineStateGL.
                super_IPipelineState.super_IDeviceObject.super_IObject == '\0')) {
    FormatString<char[26],char[35]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Name != nullptr && Name[0] != \'\\0\'",
               (char (*) [35])CONCAT44(in_register_0000000c,Stage));
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetResourceAttribution",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x45a);
    std::__cxx11::string::~string((string *)local_48);
  }
  pSignature._0_4_ = 0;
  do {
    if ((uint)msg.field_2._12_4_ <= (uint)pSignature) {
      ResourceAttribution::ResourceAttribution(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    _pSignature = Diligent::RefCntAutoPtr::operator_cast_to_PipelineResourceSignatureGLImpl_
                            ((RefCntAutoPtr *)
                             (*(char (*) [35])CONCAT44(in_register_0000000c,Stage) +
                             (ulong)(uint)pSignature * 8));
    if (_pSignature != (PipelineResourceSignatureGLImpl *)0x0) {
      UVar1 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::FindResource
                        (&_pSignature->
                          super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                         (SHADER_TYPE)Name,(char *)this);
      if (UVar1 != 0xffffffff) {
        ResourceAttribution::ResourceAttribution
                  (__return_storage_ptr__,_pSignature,(uint)pSignature,UVar1,0xffffffff);
        return __return_storage_ptr__;
      }
      UVar1 = PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::FindImmutableSampler
                        (&_pSignature->
                          super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>,
                         (SHADER_TYPE)Name,(char *)this);
      if (UVar1 != 0xffffffff) {
        ResourceAttribution::ResourceAttribution
                  (__return_storage_ptr__,_pSignature,(uint)pSignature,0xffffffff,UVar1);
        return __return_storage_ptr__;
      }
    }
    pSignature._0_4_ = (uint)pSignature + 1;
  } while( true );
}

Assistant:

static ResourceAttribution GetResourceAttribution(const char*                                Name,
                                                      SHADER_TYPE                                Stage,
                                                      const PipelineResourceSignatureImplPtrType pSignatures[],
                                                      Uint32                                     SignCount)
    {
        VERIFY_EXPR(Name != nullptr && Name[0] != '\0');
        for (Uint32 sign = 0; sign < SignCount; ++sign)
        {
            const PipelineResourceSignatureImplType* const pSignature = pSignatures[sign];
            if (pSignature == nullptr)
                continue;

            const Uint32 ResIndex = pSignature->FindResource(Stage, Name);
            if (ResIndex != ResourceAttribution::InvalidResourceIndex)
                return ResourceAttribution{pSignature, sign, ResIndex};
            else
            {
                const Uint32 ImtblSamIndex = pSignature->FindImmutableSampler(Stage, Name);
                if (ImtblSamIndex != ResourceAttribution::InvalidSamplerIndex)
                    return ResourceAttribution{pSignature, sign, ResourceAttribution::InvalidResourceIndex, ImtblSamIndex};
            }
        }
        return ResourceAttribution{};
    }